

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cxx
# Opt level: O0

void __thiscall kwssys::Directory::Directory(Directory *this)

{
  pointer pFVar1;
  DirectoryInternals *in_RDI;
  
  pFVar1 = (pointer)operator_new(0x38);
  DirectoryInternals::DirectoryInternals(in_RDI);
  (in_RDI->Files).
  super__Vector_base<kwssys::DirectoryInternals::FileData,_std::allocator<kwssys::DirectoryInternals::FileData>_>
  ._M_impl.super__Vector_impl_data._M_start = pFVar1;
  return;
}

Assistant:

Directory::Directory()
{
  this->Internal = new DirectoryInternals;
}